

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

int duckdb::History::SetMaxLength(idx_t len)

{
  size_t __size;
  void *__ptr;
  ulong uVar1;
  void *__s;
  int iVar2;
  idx_t j;
  long lVar3;
  size_t __n;
  long lVar4;
  
  uVar1 = history_len;
  __ptr = history;
  iVar2 = 0;
  if (len != 0) {
    if (history != (void *)0x0) {
      __size = len * 8;
      __s = malloc(__size);
      if (__s == (void *)0x0) {
        return 0;
      }
      lVar4 = uVar1 - len;
      if (uVar1 < len || lVar4 == 0) {
        lVar4 = 0;
        __n = uVar1 * 8;
      }
      else {
        for (lVar3 = 0; __n = __size, lVar4 != lVar3; lVar3 = lVar3 + 1) {
          free(*(void **)((long)__ptr + lVar3 * 8));
        }
      }
      switchD_004a0b15::default(__s,0,__size);
      switchD_00917c1c::default(__s,(void *)((long)__ptr + lVar4 * 8),__n);
      free(__ptr);
      history = __s;
    }
    iVar2 = 1;
    history_max_len = len;
    if (len < uVar1) {
      history_len = len;
    }
  }
  return iVar2;
}

Assistant:

int History::SetMaxLength(idx_t len) {
	char **new_entry;

	if (len < 1) {
		return 0;
	}
	if (history) {
		idx_t tocopy = history_len;

		new_entry = (char **)malloc(sizeof(char *) * len);
		if (new_entry == nullptr) {
			return 0;
		}

		/* If we can't copy everything, free the elements we'll not use. */
		if (len < tocopy) {
			for (idx_t j = 0; j < tocopy - len; j++) {
				free(history[j]);
			}
			tocopy = len;
		}
		memset(new_entry, 0, sizeof(char *) * len);
		memcpy(new_entry, history + (history_len - tocopy), sizeof(char *) * tocopy);
		free(history);
		history = new_entry;
	}
	history_max_len = len;
	if (history_len > history_max_len) {
		history_len = history_max_len;
	}
	return 1;
}